

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  BaseNode BVar1;
  byte bVar2;
  BaseNode BVar3;
  uint uVar4;
  BaseNode *pBVar5;
  long *plVar6;
  BaseBuilder *pBVar7;
  long lVar8;
  byte *pbVar9;
  undefined8 uVar10;
  bool bVar11;
  Error EVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined4 uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined4 local_40;
  undefined4 local_3c;
  undefined8 local_38;
  
  if (first != stop) {
    uVar4 = *(uint *)&(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].super_BaseEmitter.
                      _logger;
    do {
      pBVar5 = *(BaseNode **)(first + 8);
      if (((byte)first[0x11] & 0x20) != 0) {
        plVar6 = *(long **)(first + 0x20);
        BVar1 = first[0x12];
        if (plVar6 != (long *)0x0) {
          *(undefined8 *)(first + 0x20) = 0;
          uVar15 = *(uint *)(plVar6 + 2);
          bVar20 = false;
          if ((ulong)uVar15 != 0) {
            uVar17 = 0;
            do {
              lVar19 = uVar17 * 0x20;
              uVar14 = *(uint *)((long)plVar6 + lVar19 + 100);
              if (uVar14 != 0) {
                bVar2 = *(byte *)((long)plVar6 + lVar19 + 0x5a);
                do {
                  uVar18 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  if (0x19 < uVar18) {
                    _rewrite();
                    goto LAB_00149212;
                  }
                  if (bVar20 <= bVar2) {
                    bVar20 = bVar2;
                  }
                  *(uint *)(first + (ulong)uVar18 * 4 + 0x3c) = (uint)bVar2;
                  uVar14 = uVar14 - 1 & uVar14;
                } while (uVar14 != 0);
              }
              uVar14 = *(uint *)(plVar6 + uVar17 * 4 + 0xd);
              if (uVar14 != 0) {
                bVar2 = *(byte *)((long)plVar6 + lVar19 + 0x5b);
                do {
                  uVar18 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  if (0x19 < uVar18) {
LAB_00149212:
                    _rewrite();
                    return 0x1e;
                  }
                  if (bVar20 <= bVar2) {
                    bVar20 = bVar2;
                  }
                  *(uint *)(first + (ulong)uVar18 * 4 + 0x3c) = (uint)bVar2;
                  uVar14 = uVar14 - 1 & uVar14;
                } while (uVar14 != 0);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar15);
            bVar20 = 0xf < bVar20;
          }
          uVar15 = *(uint *)((long)plVar6 + 0xc);
          if ((uVar15 >> 0x1e & 1) != 0) {
            iVar13 = *(int *)(first + 0x30);
            if (iVar13 < 0x1d3) {
              if (iVar13 < 0x167) {
                if (iVar13 == 0x165) {
                  if (((*(uint *)(first + 0x40) & 0xf07) == 1) &&
                     (uVar14 = *(uint *)(first + 0x50), (uVar14 & 7) == 2)) {
                    uVar16 = 0x1de;
                    uVar18 = 0x1000000;
LAB_00148fe5:
                    *(uint *)(first + 0x50) = uVar14 & 0xfffffa | uVar18;
                    *(undefined4 *)(first + 0x30) = uVar16;
                  }
                }
                else if (iVar13 == 0x166) {
LAB_00148e98:
                  if (((*(uint *)(first + 0x40) & 0xf07) == 1) &&
                     (uVar14 = *(uint *)(first + 0x50), (uVar14 & 7) == 2)) {
                    uVar16 = 0x1b7;
                    uVar18 = 0x4000000;
                    goto LAB_00148fe5;
                  }
                }
              }
              else {
                if (iVar13 == 0x167) goto LAB_00148f41;
                if (iVar13 == 0x1bc) goto LAB_00148e98;
              }
            }
            else if (iVar13 < 0x4c0) {
              if (iVar13 == 0x1d3) {
LAB_00148f41:
                if (((*(uint *)(first + 0x40) & 0xf07) == 1) &&
                   (uVar14 = *(uint *)(first + 0x50), (uVar14 & 7) == 2)) {
                  uVar16 = 0x1b7;
                  uVar18 = 0x8000000;
                  goto LAB_00148fe5;
                }
              }
              else if (iVar13 == 0x4aa) goto LAB_00148e98;
            }
            else {
              if (iVar13 == 0x4c0) goto LAB_00148f41;
              if (((iVar13 == 0x4c8) && ((*(uint *)(first + 0x40) & 0xf07) == 1)) &&
                 (uVar14 = *(uint *)(first + 0x50), (uVar14 & 7) == 2)) {
                uVar16 = 0x1de;
                uVar18 = 0x2000000;
                goto LAB_00148fe5;
              }
            }
          }
          if (((int)uVar15 < 0 & bVar20) == 1) {
            iVar13 = *(int *)(first + 0x30);
            if (iVar13 < 0x4f0) {
              if (iVar13 < 0x485) {
                if (iVar13 < 0x3d7) {
                  uVar16 = 0x360;
                  if (iVar13 != 0x35e) {
                    if (iVar13 != 0x364) {
LAB_00149240:
                      DebugUtils::assertionFailed
                                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86rapass.cpp"
                                 ,0x4fc,"false");
                    }
                    uVar16 = 0x366;
                  }
                }
                else if (iVar13 == 0x3d7) {
                  uVar16 = 0x3d8;
                }
                else {
                  if (iVar13 != 0x3dc) goto LAB_00149240;
                  uVar16 = 0x3dd;
                }
              }
              else if (iVar13 < 0x4ac) {
                if (iVar13 == 0x485) {
                  uVar16 = 0x486;
                }
                else {
                  if (iVar13 != 0x48a) goto LAB_00149240;
                  uVar16 = 0x48b;
                }
              }
              else if (iVar13 == 0x4ac) {
                uVar16 = 0x4ad;
              }
              else {
                if (iVar13 != 0x4af) goto LAB_00149240;
                uVar16 = 0x4b1;
              }
            }
            else if (iVar13 < 0x62f) {
              if (iVar13 == 0x4f0) {
                uVar16 = 0x4f1;
              }
              else if (iVar13 == 0x4f2) {
                uVar16 = 0x4f3;
              }
              else {
                if (iVar13 != 0x5cf) goto LAB_00149240;
                uVar16 = 0x5d0;
              }
            }
            else {
              switch(iVar13) {
              case 0x64e:
                uVar16 = 0x648;
                break;
              case 0x64f:
                uVar16 = 0x64a;
                break;
              case 0x650:
                uVar16 = 0x64b;
                break;
              case 0x651:
                uVar16 = 0x64d;
                break;
              default:
                if (iVar13 != 0x62f) goto LAB_00149240;
                uVar16 = 0x630;
              }
            }
            *(undefined4 *)(first + 0x30) = uVar16;
          }
          if (((*(byte *)(plVar6 + 1) & 1) != 0) &&
             (BVar1 == (BaseNode)0x2 && *(int *)(first + 0x38) == 0)) {
            BVar3 = first[0x13];
            if ((BVar3 == (BaseNode)0x0) || ((byte)BVar3 == 1)) {
LAB_00149228:
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../x86/../core/../core/builder.h"
                         ,0x369,"index < opCapacity()");
            }
            auVar21._0_4_ = -(uint)(*(int *)(first + 0x50) == *(int *)(first + 0x40));
            auVar21._4_4_ = -(uint)(*(int *)(first + 0x54) == *(int *)(first + 0x44));
            auVar21._8_4_ = -(uint)(*(int *)(first + 0x58) == *(int *)(first + 0x48));
            auVar21._12_4_ = -(uint)(*(int *)(first + 0x5c) == *(int *)(first + 0x4c));
            iVar13 = movmskps((uint)(byte)BVar3,auVar21);
            if (iVar13 == 0xf) {
              BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
              goto LAB_00149140;
            }
          }
          if (first[0x10] == (BaseNode)0x11) {
            lVar19 = *plVar6;
            bVar11 = BaseRAPass::isNextTo
                               (&this->super_BaseRAPass,first,
                                (BaseNode *)((this->super_BaseRAPass)._func)->_exitNode);
            if (!bVar11) {
              ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
                   *(BaseNode **)first;
              local_3c = *(undefined4 *)(((this->super_BaseRAPass)._func)->_exitNode + 0x30);
              local_40 = 5;
              local_38 = 0;
              EVar12 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                                 (this,&local_40);
              if (EVar12 != 0) {
                return EVar12;
              }
            }
            uVar10 = *(undefined8 *)first;
            BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
            *(undefined8 *)(lVar19 + 0x18) = uVar10;
          }
        }
        if (BVar1 != (BaseNode)0x0) {
          pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
          lVar19 = 0;
          do {
            if ((*(uint *)(first + lVar19 + 0x40) & 0x2007) == 0x2002) {
              uVar15 = *(int *)(first + lVar19 + 0x44) - 0x100;
              if (uVar4 <= uVar15) {
                return 0x1e;
              }
              if (uVar15 < *(uint *)&pBVar7[1].super_BaseEmitter._logger) {
                lVar8 = *(long *)((long)(&(pBVar7[1].super_BaseEmitter._code)->_environment)[uVar15]
                                 + 0x28);
                if (lVar8 != 0) {
                  pbVar9 = *(byte **)(lVar8 + 0x18);
                  iVar13 = *(int *)(pbVar9 + 0x10);
                  uVar15 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature.
                           _bits;
                  *(uint *)(first + lVar19 + 0x44) = (uint)*pbVar9;
                  *(uint *)(first + lVar19 + 0x40) =
                       *(uint *)(first + lVar19 + 0x40) & 0xffffdf02 | uVar15 & 0xf8;
                  *(int *)(first + lVar19 + 0x4c) = *(int *)(first + lVar19 + 0x4c) + iVar13;
                  goto LAB_00149133;
                }
              }
              else {
                _rewrite();
              }
              _rewrite();
              goto LAB_00149228;
            }
LAB_00149133:
            lVar19 = lVar19 + 0x10;
          } while ((ulong)(byte)BVar1 * 0x10 != lVar19);
        }
      }
LAB_00149140:
      first = pBVar5;
    } while (pBVar5 != stop);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // This data is allocated by Zone passed to `runOnFunction()`, which will be reset after the RA pass finishes.
        // So reset this data to prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        // If the instruction contains pass data (raInst) then it was a subject for register allocation and must be
        // rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        // If one operand was rewritten from Reg to Mem, we have to ensure that we are using the correct instruction.
        if (raInst->isRegToMemPatched()) {
          switch (inst->id()) {
            case Inst::kIdKmovb: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(1);
                inst->setId(Inst::kIdMovzx);
              }
              break;
            }

            case Inst::kIdVmovw: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(2);
                inst->setId(Inst::kIdMovzx);
              }
              break;
            }

            case Inst::kIdMovd:
            case Inst::kIdVmovd:
            case Inst::kIdKmovd: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVD to MOV.
                operands[1].as<Mem>().setSize(4);
                inst->setId(Inst::kIdMov);
              }
              break;
            }

            case Inst::kIdMovq:
            case Inst::kIdVmovq:
            case Inst::kIdKmovq: {
              if (operands[0].isGp() && operands[1].isMem()) {
                // Transform from [V]MOVQ to MOV.
                operands[1].as<Mem>().setSize(8);
                inst->setId(Inst::kIdMov);
              }
              break;
            }

            default:
              break;
          }
        }

        // Transform VEX instruction to EVEX when necessary.
        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // Remove moves that do not do anything.
        //
        // Usually these moves are inserted during code generation and originally they used different registers. If RA
        // allocated these into the same register such redundant mov would appear.
        if (raInst->hasInstRWFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg()) {
          if (inst->opCount() == 2) {
            if (inst->op(0) == inst->op(1)) {
              cc()->removeNode(node);
              goto Next;
            }
          }
        }

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit label is next to it (optimization) or
          // patched to an architecture dependent jump instruction that jumps to the function's exit before the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

Next:
    node = next;
  }

  return kErrorOk;
}